

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O3

string * __thiscall
wabt::(anonymous_namespace)::CWriter::ModuleInstanceTypeName_abi_cxx11_
          (string *__return_storage_ptr__,CWriter *this,string_view module_name)

{
  long lVar1;
  long *plVar2;
  string *extraout_RAX;
  string *psVar3;
  size_type *psVar4;
  bool in_R8B;
  string_view name;
  string local_30;
  
  name._M_len = module_name._M_len;
  name._M_str = (char *)0x1;
  Mangle_abi_cxx11_(&local_30,this,name,in_R8B);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_30,0,(char *)0x0,0x1ec2d4);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar4) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  psVar3 = (string *)&local_30.field_2;
  if ((string *)local_30._M_dataplus._M_p != psVar3) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    psVar3 = extraout_RAX;
  }
  return psVar3;
}

Assistant:

std::string CWriter::ModuleInstanceTypeName(std::string_view module_name) {
  return kGlobalSymbolPrefix + MangleModuleName(module_name);
}